

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O3

void __thiscall DIS::EnvironmentalProcessPdu::EnvironmentalProcessPdu(EnvironmentalProcessPdu *this)

{
  SyntheticEnvironmentFamilyPdu::SyntheticEnvironmentFamilyPdu
            (&this->super_SyntheticEnvironmentFamilyPdu);
  (this->super_SyntheticEnvironmentFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__EnvironmentalProcessPdu_0019fe88;
  EntityID::EntityID(&this->_environementalProcessID);
  EntityType::EntityType(&this->_environmentType);
  this->_modelType = '\0';
  this->_environmentStatus = '\0';
  this->_numberOfEnvironmentRecords = '\0';
  this->_sequenceNumber = 0;
  (this->_environmentRecords).
  super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_environmentRecords).
  super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_environmentRecords).
  super__Vector_base<DIS::Environment,_std::allocator<DIS::Environment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,')');
  return;
}

Assistant:

EnvironmentalProcessPdu::EnvironmentalProcessPdu() : SyntheticEnvironmentFamilyPdu(),
   _environementalProcessID(), 
   _environmentType(), 
   _modelType(0), 
   _environmentStatus(0), 
   _numberOfEnvironmentRecords(0), 
   _sequenceNumber(0)
{
    setPduType( 41 );
}